

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O2

void smix1(uint8_t *B,size_t r,uint32_t N,yescrypt_flags_t flags,salsa20_blk_t *V,uint32_t NROM,
          salsa20_blk_t *VROM,salsa20_blk_t *XY,pwxform_ctx_t *ctx)

{
  long lVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  salsa20_blk_t *psVar8;
  uint uVar9;
  ulong uVar10;
  salsa20_blk_t *psVar11;
  int iVar12;
  long lVar13;
  
  lVar1 = r * 2;
  psVar8 = V;
  for (lVar4 = 0; lVar4 != lVar1; lVar4 = lVar4 + 1) {
    psVar11 = psVar8;
    for (lVar13 = 0; lVar13 != 0x140; lVar13 = lVar13 + 0x14) {
      psVar11->w[0] = *(uint32_t *)(B + ((ulong)((uint)lVar13 & 0x3c) | lVar4 << 6));
      psVar11 = (salsa20_blk_t *)(psVar11->w + 1);
    }
    psVar8 = psVar8 + 1;
  }
  if (VROM == (salsa20_blk_t *)0x0) {
    if ((flags & YESCRYPT_RW) == 0) {
      uVar2 = 1;
      psVar8 = V;
      while( true ) {
        psVar11 = V + (ulong)uVar2 * lVar1;
        blockmix_salsa8(psVar8,psVar11,r);
        if (N - 1 <= uVar2) break;
        psVar8 = V + (ulong)(uVar2 + 1) * lVar1;
        blockmix_salsa8(psVar11,psVar8,r);
        uVar2 = uVar2 + 2;
      }
      blockmix_salsa8(psVar11,XY,r);
      goto LAB_00118259;
    }
    blockmix(V,V + r * 2,r,ctx);
    psVar8 = V + r * 4;
    blockmix(V + r * 2,psVar8,r,ctx);
    uVar2 = psVar8[r * 2 + -1].w[0];
    uVar7 = 2;
    while( true ) {
      uVar5 = (uint)uVar7;
      if (N <= uVar5) break;
      uVar6 = ~uVar5 + N;
      if (uVar5 < N >> 1) {
        uVar6 = uVar5;
      }
      uVar10 = 1;
      while (uVar9 = (uint)uVar10, uVar9 < uVar6) {
        uVar3 = blockmix_xor(psVar8,V + (ulong)((uVar9 + (uVar2 & uVar5 - 1)) - 1) * lVar1,
                             V + uVar7 * lVar1 + uVar10 * lVar1,r,0,ctx);
        psVar8 = V + uVar7 * lVar1 + (ulong)(uVar9 + 1) * lVar1;
        uVar2 = blockmix_xor(V + uVar7 * lVar1 + uVar10 * lVar1,
                             V + (ulong)((uVar3 & uVar5 - 1) + uVar9) * lVar1,psVar8,r,0,ctx);
        uVar10 = (ulong)(uVar9 + 2);
      }
      uVar7 = (ulong)(uVar5 * 2);
    }
    uVar5 = uVar5 >> 1;
    psVar11 = V + (ulong)(N - 1) * lVar1;
    uVar3 = blockmix_xor(psVar8,V + (ulong)(((N - uVar5) + (uVar2 & uVar5 - 1)) - 2) * lVar1,psVar11
                         ,r,0,ctx);
    psVar8 = V + (ulong)(((N - 1) - uVar5) + (uVar5 - 1 & uVar3)) * lVar1;
    iVar12 = 0;
  }
  else {
    psVar11 = V + r * 2;
    blockmix(V,psVar11,r,ctx);
    psVar8 = V + r * 4;
    uVar5 = NROM - 1;
    uVar2 = blockmix_xor(psVar11,VROM + (ulong)(psVar11[r * 2 + -1].w[0] & uVar5) * lVar1,psVar8,r,1
                         ,ctx);
    uVar7 = 2;
    while( true ) {
      uVar6 = (uint)uVar7;
      if (N <= uVar6) break;
      uVar9 = ~uVar6 + N;
      if (uVar6 < N >> 1) {
        uVar9 = uVar6;
      }
      uVar10 = 0;
      while (iVar12 = (int)uVar10, iVar12 + 1U < uVar9) {
        uVar3 = blockmix_xor(psVar8,V + (ulong)((uVar2 & uVar6 - 1) + iVar12) * lVar1,
                             V + uVar7 * lVar1 + (ulong)(iVar12 + 1U) * lVar1,r,0,ctx);
        uVar10 = (ulong)(iVar12 + 2);
        psVar8 = V + uVar7 * lVar1 + uVar10 * lVar1;
        uVar2 = blockmix_xor(V + uVar7 * lVar1 + (ulong)(iVar12 + 1U) * lVar1,
                             VROM + (ulong)(uVar3 & uVar5) * lVar1,psVar8,r,1,ctx);
      }
      uVar7 = (ulong)(uVar6 * 2);
    }
    psVar11 = V + (ulong)(N - 1) * lVar1;
    uVar3 = blockmix_xor(psVar8,V + (ulong)(((N - (uVar6 >> 1)) + ((uVar6 >> 1) - 1 & uVar2)) - 2) *
                                    lVar1,psVar11,r,0,ctx);
    psVar8 = VROM + (ulong)(uVar5 & uVar3) * lVar1;
    iVar12 = 1;
  }
  blockmix_xor(psVar11,psVar8,XY,r,iVar12,ctx);
LAB_00118259:
  for (lVar4 = 0; lVar4 != lVar1; lVar4 = lVar4 + 1) {
    psVar8 = XY;
    for (lVar13 = 0; lVar13 != 0x140; lVar13 = lVar13 + 0x14) {
      *(uint32_t *)(B + ((ulong)((uint)lVar13 & 0x3c) | lVar4 << 6)) = psVar8->w[0];
      psVar8 = (salsa20_blk_t *)(psVar8->w + 1);
    }
    XY = XY + 1;
  }
  return;
}

Assistant:

static void
smix1(uint8_t * B, size_t r, uint32_t N, yescrypt_flags_t flags,
    salsa20_blk_t * V, uint32_t NROM, const salsa20_blk_t * VROM,
    salsa20_blk_t * XY, pwxform_ctx_t * ctx)
{
	size_t s = 2 * r;
	salsa20_blk_t * X = V, * Y;
	uint32_t i, j;
	size_t k;

	/* 1: X <-- B */
	/* 3: V_i <-- X */
	for (k = 0; k < 2 * r; k++) {
		for (i = 0; i < 16; i++) {
			X[k].w[i] = le32dec(&B[(k * 16 + (i * 5 % 16)) * 4]);
		}
	}

	if (VROM) {
		uint32_t n;
		salsa20_blk_t * V_n;
		const salsa20_blk_t * V_j;

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[s];
		blockmix(X, Y, r, ctx);

		X = &V[2 * s];
		/* j <-- Integerify(X) mod NROM */
		j = integerify(Y, r) & (NROM - 1);
		V_j = &VROM[j * s];

		/* X <-- H(X \xor VROM_j) */
		j = blockmix_xor(Y, V_j, X, r, 1, ctx);

		for (n = 2; n < N; n <<= 1) {
			uint32_t m = (n < N / 2) ? n : (N - 1 - n);

			V_n = &V[n * s];

			/* 2: for i = 0 to N - 1 do */
			for (i = 1; i < m; i += 2) {
				/* j <-- Wrap(Integerify(X), i) */
				j &= n - 1;
				j += i - 1;
				V_j = &V[j * s];

				/* X <-- X \xor V_j */
				/* 4: X <-- H(X) */
				/* 3: V_i <-- X */
				Y = &V_n[i * s];

				/* j <-- Integerify(X) mod NROM */
				j = blockmix_xor(X, V_j, Y, r, 0, ctx) & (NROM - 1);
				V_j = &VROM[j * s];

				/* X <-- H(X \xor VROM_j) */
				X = &V_n[(i + 1) * s];
				j = blockmix_xor(Y, V_j, X, r, 1, ctx);
			}
		}

		n >>= 1;

		/* j <-- Wrap(Integerify(X), i) */
		j &= n - 1;
		j += N - 2 - n;
		V_j = &V[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[(N - 1) * s];

		/* j <-- Integerify(X) mod NROM */
		j = blockmix_xor(X, V_j, Y, r, 0, ctx) & (NROM - 1);
		V_j = &VROM[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		X = XY;
		blockmix_xor(Y, V_j, X, r, 1, ctx);
	} else if (flags & YESCRYPT_RW) {
		uint32_t n;
		salsa20_blk_t * V_n, * V_j;

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[s];
		blockmix(X, Y, r, ctx);

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		X = &V[2 * s];
		blockmix(Y, X, r, ctx);
		j = integerify(X, r);

		for (n = 2; n < N; n <<= 1) {
			uint32_t m = (n < N / 2) ? n : (N - 1 - n);

			V_n = &V[n * s];

			/* 2: for i = 0 to N - 1 do */
			for (i = 1; i < m; i += 2) {
				Y = &V_n[i * s];

				/* j <-- Wrap(Integerify(X), i) */
				j &= n - 1;
				j += i - 1;
				V_j = &V[j * s];

				/* X <-- X \xor V_j */
				/* 4: X <-- H(X) */
				/* 3: V_i <-- X */
				j = blockmix_xor(X, V_j, Y, r, 0, ctx);

				/* j <-- Wrap(Integerify(X), i) */
				j &= n - 1;
				j += i;
				V_j = &V[j * s];

				/* X <-- X \xor V_j */
				/* 4: X <-- H(X) */
				/* 3: V_i <-- X */
				X = &V_n[(i + 1) * s];
				j = blockmix_xor(Y, V_j, X, r, 0, ctx);
			}
		}

		n >>= 1;

		/* j <-- Wrap(Integerify(X), i) */
		j &= n - 1;
		j += N - 2 - n;
		V_j = &V[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[(N - 1) * s];
		j = blockmix_xor(X, V_j, Y, r, 0, ctx);

		/* j <-- Wrap(Integerify(X), i) */
		j &= n - 1;
		j += N - 1 - n;
		V_j = &V[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		X = XY;
		blockmix_xor(Y, V_j, X, r, 0, ctx);
	} else {
		/* 2: for i = 0 to N - 1 do */
		for (i = 1; i < N - 1; i += 2) {
			/* 4: X <-- H(X) */
			/* 3: V_i <-- X */
			Y = &V[i * s];
			blockmix_salsa8(X, Y, r);

			/* 4: X <-- H(X) */
			/* 3: V_i <-- X */
			X = &V[(i + 1) * s];
			blockmix_salsa8(Y, X, r);
		}

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[i * s];
		blockmix_salsa8(X, Y, r);

		/* 4: X <-- H(X) */
		X = XY;
		blockmix_salsa8(Y, X, r);
	}

	/* B' <-- X */
	for (k = 0; k < 2 * r; k++) {
		for (i = 0; i < 16; i++) {
			le32enc(&B[(k * 16 + (i * 5 % 16)) * 4], X[k].w[i]);
		}
	}
}